

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

CPpmd_See * Ppmd7_MakeEscFreq(CPpmd7 *p,uint numMasked,UInt32 *escFreq)

{
  ushort uVar1;
  CPpmd7_Context *pCVar2;
  CPpmd_See *pCVar3;
  uint uVar4;
  UInt32 UVar5;
  ulong uVar6;
  ulong uVar7;
  
  pCVar2 = p->MinContext;
  uVar1 = pCVar2->NumStats;
  if (uVar1 == 0x100) {
    pCVar3 = &p->DummySee;
    UVar5 = 1;
  }
  else {
    uVar4 = uVar1 - numMasked;
    uVar7 = (ulong)(uVar4 < (uint)*(ushort *)(p->Base + pCVar2->Suffix) - (uint)uVar1);
    uVar6 = (ulong)((uint)pCVar2->SummFreq < (uint)uVar1 * 0xb);
    pCVar3 = p->See[p->NS2Indx[uVar4 - 1]] +
             uVar7 + uVar6 * 2 + (ulong)(uVar4 < numMasked) * 4 + (ulong)p->HiBitsFlag;
    uVar1 = pCVar3->Summ >>
            (p->See[p->NS2Indx[uVar4 - 1]]
             [uVar7 + uVar6 * 2 + (ulong)(uVar4 < numMasked) * 4 + (ulong)p->HiBitsFlag].Shift &
            0x1f);
    pCVar3->Summ = pCVar3->Summ - uVar1;
    UVar5 = (uint)uVar1 + (uint)(uVar1 == 0);
  }
  *escFreq = UVar5;
  return pCVar3;
}

Assistant:

static CPpmd_See *Ppmd7_MakeEscFreq(CPpmd7 *p, unsigned numMasked, UInt32 *escFreq)
{
  CPpmd_See *see;
  unsigned nonMasked = p->MinContext->NumStats - numMasked;
  if (p->MinContext->NumStats != 256)
  {
    see = p->See[p->NS2Indx[nonMasked - 1]] +
        (nonMasked < (unsigned)SUFFIX(p->MinContext)->NumStats - p->MinContext->NumStats) +
        2 * (p->MinContext->SummFreq < 11 * p->MinContext->NumStats) +
        4 * (numMasked > nonMasked) +
        p->HiBitsFlag;
    {
      unsigned r = (see->Summ >> see->Shift);
      see->Summ = (UInt16)(see->Summ - r);
      *escFreq = r + (r == 0);
    }
  }
  else
  {
    see = &p->DummySee;
    *escFreq = 1;
  }
  return see;
}